

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * __thiscall Kvm::expandClauses(Kvm *this,Value *clauses)

{
  pointer *ppppVVar1;
  _func_int **pp_Var2;
  Value *pVVar3;
  runtime_error *this_00;
  Value *result2;
  Value *result1;
  Value *local_58;
  Value *local_50 [4];
  
  if (this->NIL == clauses) {
    pVVar3 = this->FALSE;
  }
  else {
    pp_Var2 = clauses[1]._vptr_Value;
    pVVar3 = *(Value **)&clauses[1].type_;
    if ((Value *)pp_Var2[3] == this->ELSE) {
      if (pVVar3 == this->NIL) {
        pVVar3 = sequence(this,(Value *)pp_Var2[4]);
        return pVVar3;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = (Value *)(local_50 + 2);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"else clause isn\'t last","");
      std::runtime_error::runtime_error(this_00,(string *)local_50);
      *(undefined ***)this_00 = &PTR__runtime_error_00113b28;
      __cxa_throw(this_00,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    local_50[0] = (Value *)0x0;
    local_58 = (Value *)0x0;
    Kgc::pushLocalStackRoot(&this->gc_,local_50);
    Kgc::pushLocalStackRoot(&this->gc_,&local_58);
    local_50[0] = sequence(this,(Value *)pp_Var2[4]);
    local_58 = expandClauses(this,pVVar3);
    pVVar3 = makeIf(this,(Value *)pp_Var2[3],local_50[0],local_58);
    ppppVVar1 = &(this->gc_).localStackRoots_.
                 super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    *ppppVVar1 = *ppppVVar1 + -2;
  }
  return pVVar3;
}

Assistant:

const Value* Kvm::expandClauses(const Value *clauses)
{
    if (clauses == NIL)
    {
        return FALSE;
    } else
    {
        auto first = car(clauses);
        auto rest  = cdr(clauses);
        if (isCondElseClause(first))
        {
            if (rest == NIL)
            {
                 return sequence(condActions(first));
            } else
            {
                throw KatException("else clause isn't last");
            }
        } else
        {
            const Value *result1 = nullptr;
            const Value *result2 = nullptr;
            GcGuard guard{gc_};
            guard.pushLocalStackRoot(&result1);
            guard.pushLocalStackRoot(&result2);

            result1 = sequence(condActions(first));
            result2 = expandClauses(rest);
            result1 = makeIf(condPredicate(first), result1, result2);
            return result1;
        }
    }
}